

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floating_point_stream_compression.c
# Opt level: O1

void trico_decompress(uint32_t *number_of_floats,float **out,uint8_t *compressed)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  void *__ptr;
  void *__ptr_00;
  float *pfVar6;
  sbyte sVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  float fVar13;
  ulong uVar14;
  float fVar15;
  byte *pbVar16;
  uint uVar17;
  int j;
  long lVar18;
  uint uVar19;
  uint uVar20;
  size_t __nmemb;
  ulong uVar21;
  uint32_t xor [8];
  uint32_t bcode [8];
  uint auStack_c8 [11];
  uint local_9c;
  uint local_98;
  uint local_94;
  float *local_90;
  void *local_88;
  byte *local_80;
  uint local_78;
  int local_74;
  uint32_t *local_70;
  ulong local_68;
  float *local_60;
  uint auStack_58 [10];
  
  bVar2 = *compressed;
  uVar11 = bVar2 >> 3 & 0xfffffffe;
  uVar17 = (uint)bVar2 + (uint)bVar2 & 0x1e;
  sVar7 = (sbyte)uVar11;
  __nmemb = 1L << (sbyte)uVar17;
  local_94 = (int)(1L << sVar7) - 1;
  local_98 = (int)__nmemb - 1;
  local_88 = calloc(1L << sVar7,4);
  __ptr_00 = calloc(__nmemb,4);
  bVar2 = compressed[1];
  *number_of_floats = (uint)bVar2 << 0x18;
  uVar9 = (uint)compressed[2] << 0x10 | (uint)bVar2 << 0x18;
  *number_of_floats = uVar9;
  uVar9 = (uint)compressed[3] << 8 | uVar9;
  *number_of_floats = uVar9;
  local_80 = compressed + 5;
  uVar9 = compressed[4] | uVar9;
  *number_of_floats = uVar9;
  local_70 = number_of_floats;
  pfVar6 = (float *)malloc((ulong)uVar9 * 4);
  __ptr = local_88;
  *out = pfVar6;
  uVar14 = 0;
  local_9c = uVar11;
  if (uVar9 < 8) {
    local_90 = pfVar6;
    uVar9 = 0;
    uVar12 = 0;
    uVar11 = 0;
    fVar13 = 0.0;
  }
  else {
    local_78 = uVar17;
    uVar19 = (uVar9 >> 3) + (uint)(uVar9 >> 3 == 0);
    local_90 = (float *)0x0;
    fVar13 = 0.0;
    uVar11 = 0;
    uVar12 = 0;
    uVar9 = 0;
    uVar14 = 0;
    local_68 = (ulong)uVar19;
    local_74 = 0x20 - uVar17;
    do {
      local_60 = pfVar6;
      bVar2 = *local_80;
      bVar3 = local_80[1];
      bVar4 = local_80[2];
      local_80 = local_80 + 3;
      bVar8 = 0;
      lVar18 = 0;
      do {
        uVar20 = ((uint)bVar4 | (uint)bVar3 << 8 | (uint)bVar2 << 0x10) >> (bVar8 & 0x1f) & 7;
        auStack_58[lVar18] = uVar20;
        switch(uVar20) {
        case 0:
          auStack_c8[lVar18] = 0;
          goto LAB_0010a257;
        case 1:
          uVar20 = (uint)*local_80;
          local_80 = local_80 + 1;
          goto LAB_0010a252;
        case 2:
          uVar20 = (uint)*local_80 << 8;
          auStack_c8[lVar18] = uVar20;
          bVar5 = local_80[1];
          local_80 = local_80 + 2;
          break;
        default:
          bVar5 = *local_80;
          auStack_c8[lVar18] = (uint)bVar5 << 0x10;
          uVar20 = (uint)local_80[1] << 8 | (uint)bVar5 << 0x10;
          auStack_c8[lVar18] = uVar20;
          bVar5 = local_80[2];
          local_80 = local_80 + 3;
          break;
        case 4:
          bVar5 = *local_80;
          auStack_c8[lVar18] = (uint)bVar5 << 0x18;
          uVar20 = (uint)local_80[1] << 0x10 | (uint)bVar5 << 0x18;
          auStack_c8[lVar18] = uVar20;
          uVar20 = (uint)local_80[2] << 8 | uVar20;
          auStack_c8[lVar18] = uVar20;
          bVar5 = local_80[3];
          local_80 = local_80 + 4;
          goto LAB_0010a24d;
        case 5:
          uVar20 = (uint)*local_80;
          local_80 = local_80 + 1;
          goto LAB_0010a1e6;
        case 6:
          uVar20 = (uint)*local_80 << 8;
          auStack_c8[lVar18] = uVar20;
          bVar5 = local_80[1];
          local_80 = local_80 + 2;
LAB_0010a24d:
          uVar20 = bVar5 | uVar20;
LAB_0010a252:
          auStack_c8[lVar18] = uVar20;
          goto LAB_0010a257;
        }
        uVar20 = bVar5 | uVar20;
LAB_0010a1e6:
        auStack_c8[lVar18] = uVar20;
LAB_0010a257:
        lVar18 = lVar18 + 1;
        bVar8 = bVar8 + 3;
      } while (lVar18 != 8);
      lVar18 = 0;
      fVar15 = fVar13;
      do {
        if (*(uint *)((long)auStack_58 + lVar18) < 5) {
          uVar11 = uVar9;
        }
        fVar13 = (float)(uVar11 ^ *(uint *)((long)auStack_c8 + lVar18));
        *(float *)((long)local_88 + uVar14 * 4) = fVar13;
        uVar14 = (ulong)(((uint)fVar13 >> (0x20U - sVar7 & 0x1f) ^ (int)uVar14 << sVar7) & local_94)
        ;
        *(int *)((long)__ptr_00 + uVar12 * 4) = (int)fVar13 - (int)fVar15;
        uVar9 = *(uint *)((long)local_88 + uVar14 * 4);
        uVar12 = (ulong)(((uint)((int)fVar13 - (int)fVar15) >> ((byte)(0x20 - uVar17) & 0x1f) ^
                         (int)uVar12 << (sbyte)(uVar17 >> 1)) & local_98);
        uVar11 = *(int *)((long)__ptr_00 + uVar12 * 4) + (int)fVar13;
        *(float *)((long)local_60 + lVar18) = fVar13;
        lVar18 = lVar18 + 4;
        fVar15 = fVar13;
      } while (lVar18 != 0x20);
      uVar20 = (int)local_90 + 1;
      local_90 = (float *)(ulong)uVar20;
      pfVar6 = local_60 + 8;
    } while (uVar20 != uVar19);
    local_90 = local_60 + 8;
    uVar17 = local_78;
  }
  if ((*local_70 & 7) != 0) {
    bVar2 = *local_80;
    bVar3 = local_80[1];
    bVar4 = local_80[2];
    pbVar16 = local_80 + 3;
    uVar21 = 8;
    uVar10 = 0;
    auStack_58[0] = bVar4 & 7;
    bVar8 = 0;
    switch(auStack_58[0]) {
    case 0:
      goto switchD_0010a38b_caseD_0;
    case 1:
      goto switchD_0010a38b_caseD_1;
    default:
      goto switchD_0010a38b_caseD_2;
    case 3:
    case 7:
      goto switchD_0010a38b_caseD_3;
    case 4:
      goto switchD_0010a38b_caseD_4;
    case 5:
      goto switchD_0010a38b_caseD_5;
    }
  }
LAB_0010a42c:
  free(__ptr);
  free(__ptr_00);
  return;
switchD_0010a38b_caseD_0:
  auStack_c8[uVar10] = 0;
LAB_0010a50b:
  uVar10 = uVar10 + 1;
  if ((long)(int)uVar21 <= (long)uVar10) {
    if (0 < (int)uVar21) {
      uVar10 = 0;
      do {
        if (auStack_58[uVar10] < 5) {
          uVar11 = uVar9;
        }
        fVar15 = (float)(uVar11 ^ auStack_c8[uVar10]);
        *(float *)((long)__ptr + uVar14 * 4) = fVar15;
        uVar19 = ((uint)fVar15 >> (0x20 - (byte)local_9c & 0x1f) ^
                 (int)uVar14 << ((byte)local_9c & 0x1f)) & local_94;
        *(int *)((long)__ptr_00 + uVar12 * 4) = (int)fVar15 - (int)fVar13;
        uVar9 = *(uint *)((long)__ptr + (ulong)uVar19 * 4);
        uVar12 = (ulong)(((uint)((int)fVar15 - (int)fVar13) >> (0x20U - (char)uVar17 & 0x1f) ^
                         (int)uVar12 << (sbyte)(uVar17 >> 1)) & local_98);
        uVar11 = *(int *)((long)__ptr_00 + uVar12 * 4) + (int)fVar15;
        local_90[uVar10] = fVar15;
        uVar10 = uVar10 + 1;
        uVar14 = (ulong)uVar19;
        fVar13 = fVar15;
      } while (uVar21 != uVar10);
    }
    goto LAB_0010a42c;
  }
  bVar8 = bVar8 + 3;
  uVar19 = ((uint)bVar4 | (uint)bVar3 << 8 | (uint)bVar2 << 0x10) >> (bVar8 & 0x1f) & 7;
  auStack_58[uVar10] = uVar19;
  switch(uVar19) {
  case 0:
    goto switchD_0010a38b_caseD_0;
  case 1:
switchD_0010a38b_caseD_1:
    bVar5 = *pbVar16;
    pbVar16 = pbVar16 + 1;
    auStack_c8[uVar10] = (uint)bVar5;
    if (bVar5 == 0) {
      uVar21 = uVar10 & 0xffffffff;
    }
    goto LAB_0010a50b;
  default:
switchD_0010a38b_caseD_2:
    uVar19 = (uint)*pbVar16 << 8;
    auStack_c8[uVar10] = uVar19;
    bVar5 = pbVar16[1];
    pbVar16 = pbVar16 + 2;
    break;
  case 3:
  case 7:
switchD_0010a38b_caseD_3:
    bVar5 = *pbVar16;
    auStack_c8[uVar10] = (uint)bVar5 << 0x10;
    uVar19 = (uint)pbVar16[1] << 8 | (uint)bVar5 << 0x10;
    auStack_c8[uVar10] = uVar19;
    pbVar1 = pbVar16 + 2;
    pbVar16 = pbVar16 + 3;
    uVar19 = *pbVar1 | uVar19;
    goto LAB_0010a507;
  case 4:
switchD_0010a38b_caseD_4:
    bVar5 = *pbVar16;
    auStack_c8[uVar10] = (uint)bVar5 << 0x18;
    uVar19 = (uint)pbVar16[1] << 0x10 | (uint)bVar5 << 0x18;
    auStack_c8[uVar10] = uVar19;
    uVar19 = (uint)pbVar16[2] << 8 | uVar19;
    auStack_c8[uVar10] = uVar19;
    bVar5 = pbVar16[3];
    pbVar16 = pbVar16 + 4;
    break;
  case 5:
switchD_0010a38b_caseD_5:
    uVar19 = (uint)*pbVar16;
    pbVar16 = pbVar16 + 1;
LAB_0010a507:
    auStack_c8[uVar10] = uVar19;
    goto LAB_0010a50b;
  }
  auStack_c8[uVar10] = bVar5 | uVar19;
  goto LAB_0010a50b;
}

Assistant:

void trico_decompress(uint32_t* number_of_floats, float** out, const uint8_t* compressed)
  {
  uint8_t hash_info = *compressed++;

  uint32_t hash1_size_exponent = (hash_info >> 4) << 1;
  uint32_t hash2_size_exponent = (hash_info & 15) << 1;

  const uint32_t hash1_size = 1 << hash1_size_exponent;
  const uint32_t hash2_size = 1 << hash2_size_exponent;
  const uint32_t hash1_mask = hash1_size - 1;
  const uint32_t hash2_mask = hash2_size - 1;

  uint32_t* hash_table_1 = (uint32_t*)trico_calloc(hash1_size, 4);
  uint32_t* hash_table_2 = (uint32_t*)trico_calloc(hash2_size, 4);

  *number_of_floats = ((uint32_t)(*compressed++)) << 24;
  *number_of_floats |= ((uint32_t)(*compressed++)) << 16;
  *number_of_floats |= ((uint32_t)(*compressed++)) << 8;
  *number_of_floats |= ((uint32_t)(*compressed++));
  *out = (float*)trico_malloc(*number_of_floats * sizeof(float));

  uint32_t bc;
  uint32_t bcode[8];
  uint32_t xor[8];
  uint32_t value;
  uint32_t hash1 = 0;
  uint32_t prediction1 = 0;
  uint32_t hash2 = 0;
  uint32_t prediction2 = 0;
  uint32_t stride;
  uint32_t last_value = 0;
  uint32_t* p_out = (uint32_t*)(*out);

  const uint32_t cnt = *number_of_floats / 8;
  for (uint32_t q = 0; q < cnt; ++q)
    {
    bc = ((uint32_t)(*compressed++)) << 16;
    bc |= ((uint32_t)(*compressed++)) << 8;
    bc |= (*compressed++);
    for (int j = 0; j < 8; ++j)
      {
      uint8_t b = (bc >> (j * 3)) & 7;
      bcode[j] = b;
      switch (b)
        {
        case 0:
        {
        xor[j] = 0;
        break;
        }
        case 1:
        {
        xor[j] = ((uint32_t)(*compressed++));
        break;
        }
        case 2:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 3:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 16;
        xor[j] |= ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 4:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 24;
        xor[j] |= ((uint32_t)(*compressed++)) << 16;
        xor[j] |= ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 5:
        {
        xor[j] = ((uint32_t)(*compressed++));
        break;
        }
        case 6:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 7:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 16;
        xor[j] |= ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        }
      }
    for (int j = 0; j < 8; ++j)
      {
      if (bcode[j] > 4)
        prediction1 = prediction2;

      value = xor[j] ^ prediction1;

      hash_table_1[hash1] = value;
      hash1 = trico_compute_hash1_32(hash1, value, hash1_size_exponent, hash1_mask);
      prediction1 = hash_table_1[hash1];

      stride = value - last_value;
      hash_table_2[hash2] = stride;
      hash2 = trico_compute_hash2_32(hash2, stride, hash2_size_exponent, hash2_mask);
      prediction2 = value + hash_table_2[hash2];
      last_value = value;

      *p_out++ = value;
      }
    }

  if (*number_of_floats & 7)
    {
    bc = ((uint32_t)(*compressed++)) << 16;
    bc |= ((uint32_t)(*compressed++)) << 8;
    bc |= (*compressed++);
    int max_j = 8;
    for (int j = 0; j < max_j; ++j)
      {
      uint8_t b = (bc >> (j * 3)) & 7;
      bcode[j] = b;
      switch (b)
        {
        case 0:
        {
        xor[j] = 0;
        break;
        }
        case 1:
        {
        xor[j] = ((uint32_t)(*compressed++));
        if (xor[j] == 0)
          max_j = j;
        break;
        }
        case 2:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 3:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 16;
        xor[j] |= ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 4:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 24;
        xor[j] |= ((uint32_t)(*compressed++)) << 16;
        xor[j] |= ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 5:
        {
        xor[j] = ((uint32_t)(*compressed++));
        break;
        }
        case 6:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 7:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 16;
        xor[j] |= ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        }
      }
    for (int j = 0; j < max_j; ++j)
      {
      if (bcode[j] > 4)
        prediction1 = prediction2;

      value = xor[j] ^ prediction1;

      hash_table_1[hash1] = value;
      hash1 = trico_compute_hash1_32(hash1, value, hash1_size_exponent, hash1_mask);
      prediction1 = hash_table_1[hash1];

      stride = value - last_value;
      hash_table_2[hash2] = stride;
      hash2 = trico_compute_hash2_32(hash2, stride, hash2_size_exponent, hash2_mask);
      prediction2 = value + hash_table_2[hash2];
      last_value = value;

      *p_out++ = value;
      }
    }

  trico_free(hash_table_1);
  trico_free(hash_table_2);
  }